

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

VkResult vkb::detail::
         get_vector<VkPresentModeKHR,VkResult(*&)(VkPhysicalDevice_T*,VkSurfaceKHR_T*,unsigned_int*,VkPresentModeKHR*),VkPhysicalDevice_T*const&,VkSurfaceKHR_T*const&>
                   (vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *out,
                   _func_VkResult_VkPhysicalDevice_T_ptr_VkSurfaceKHR_T_ptr_uint_ptr_VkPresentModeKHR_ptr
                   **f,VkPhysicalDevice_T **ts,VkSurfaceKHR_T **ts_1)

{
  uint in_EAX;
  VkResult VVar1;
  uint32_t count;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  do {
    VVar1 = (**f)(*ts,*ts_1,(uint *)((long)&uStack_38 + 4),(VkPresentModeKHR *)0x0);
    if (VVar1 != VK_SUCCESS) {
      return VVar1;
    }
    std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::resize(out,uStack_38 >> 0x20);
    VVar1 = (**f)(*ts,*ts_1,(uint *)((long)&uStack_38 + 4),
                  (out->super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>).
                  _M_impl.super__Vector_impl_data._M_start);
    std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::resize(out,uStack_38 >> 0x20);
  } while (VVar1 == VK_INCOMPLETE);
  return VVar1;
}

Assistant:

auto get_vector(std::vector<T>& out, F&& f, Ts&&... ts) -> VkResult {
    uint32_t count = 0;
    VkResult err;
    do {
        err = f(ts..., &count, nullptr);
        if (err != VK_SUCCESS) {
            return err;
        };
        out.resize(count);
        err = f(ts..., &count, out.data());
        out.resize(count);
    } while (err == VK_INCOMPLETE);
    return err;
}